

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::transcode_uastc_to_etc1
               (unpacked_uastc_block *unpacked_src_blk,color32 (*block_pixels) [4],void *pDst)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  uint32_t i;
  int iVar4;
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0 aVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint8_t *puVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  uint8_t *puVar22;
  color32 block_colors [2];
  uint8_t *local_60;
  int local_58 [4];
  color32 block_colors_1 [4];
  
  if (unpacked_src_blk->m_mode == 8) {
    *(byte *)((long)pDst + 3) =
         (byte)(unpacked_src_blk->m_etc1_inten0 << 2) |
         (byte)(unpacked_src_blk->m_etc1_inten0 << 5) | unpacked_src_blk->m_etc1_diff * '\x02';
    bVar3 = (byte)unpacked_src_blk->m_etc1_r;
    if (unpacked_src_blk->m_etc1_diff == true) {
      *(byte *)pDst = bVar3 << 3;
      *(char *)((long)pDst + 1) = (char)unpacked_src_blk->m_etc1_g << 3;
      bVar3 = (char)unpacked_src_blk->m_etc1_b << 3;
    }
    else {
      *(byte *)pDst = (byte)(unpacked_src_blk->m_etc1_r << 4) | bVar3;
      *(byte *)((long)pDst + 1) =
           (byte)(unpacked_src_blk->m_etc1_g << 4) | (byte)unpacked_src_blk->m_etc1_g;
      bVar3 = (byte)(unpacked_src_blk->m_etc1_b << 4) | (byte)unpacked_src_blk->m_etc1_b;
    }
    *(byte *)((long)pDst + 2) = bVar3;
    *(undefined4 *)((long)pDst + 4) =
         *(undefined4 *)(s_etc1_solid_selectors + (ulong)unpacked_src_blk->m_etc1_selector * 4);
  }
  else {
    bVar1 = unpacked_src_blk->m_etc1_flip;
    bVar2 = unpacked_src_blk->m_etc1_diff;
    *(byte *)((long)pDst + 3) =
         (byte)(unpacked_src_blk->m_etc1_inten1 << 2) |
         (byte)(unpacked_src_blk->m_etc1_inten0 << 5) | bVar1 + bVar2 * '\x02';
    uVar14 = (uint)bVar2 << 4 | 0xf;
    lVar13 = (ulong)bVar1 * 0x20 + 0x1cdf41;
    for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
      iVar4 = 0;
      iVar16 = 0;
      iVar7 = 0;
      for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
        bVar3 = *(byte *)(lVar13 + lVar11 * 2);
        bVar6 = *(byte *)(lVar13 + -1 + lVar11 * 2);
        iVar4 = iVar4 + (uint)block_pixels[bVar3][bVar6].field_0.field_0.r;
        iVar16 = iVar16 + (uint)block_pixels[bVar3][bVar6].field_0.field_0.g;
        iVar7 = iVar7 + (uint)block_pixels[bVar3][bVar6].field_0.field_0.b;
      }
      block_colors[lVar21].field_0.field_0.r = (uint8_t)((ulong)(iVar4 * uVar14 + 0x3fc) / 0x7f8);
      block_colors[lVar21].field_0.field_0.g = (uint8_t)((iVar16 * uVar14 + 0x3fc) / 0x7f8);
      block_colors[lVar21].field_0.field_0.b = (uint8_t)((iVar7 * uVar14 + 0x3fc) / 0x7f8);
      block_colors[lVar21].field_0.field_0.a = '\0';
      if ((0x1d00UL >> ((ulong)unpacked_src_blk->m_mode & 0x3f) & 1) == 0) {
        aVar5 = (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)
                apply_etc1_bias((color32 *)&block_colors[lVar21].field_0.field_0,
                                unpacked_src_blk->m_etc1_bias,uVar14,(uint32_t)lVar21);
        block_colors[lVar21].field_0.field_0 = aVar5;
      }
      lVar13 = lVar13 + 0x10;
    }
    if (bVar2 == false) {
      bVar3 = block_colors[0].field_0.field_0.r << 4 | block_colors[1].field_0.field_0.r;
      bVar6 = block_colors[0].field_0.field_0.g << 4 | block_colors[1].field_0.field_0.g;
      bVar10 = block_colors[0].field_0.field_0.b << 4 | block_colors[1].field_0.field_0.b;
    }
    else {
      iVar16 = (uint)(byte)block_colors[1].field_0._0_1_ - (uint)(byte)block_colors[0].field_0._0_1_
      ;
      iVar19 = (uint)(byte)block_colors[1].field_0._1_1_ - (uint)(byte)block_colors[0].field_0._1_1_
      ;
      iVar17 = (uint)(byte)block_colors[1].field_0._2_1_ - (uint)(byte)block_colors[0].field_0._2_1_
      ;
      iVar7 = 3;
      iVar4 = iVar7;
      if (iVar16 < 3) {
        iVar4 = iVar16;
      }
      if (iVar4 < -3) {
        iVar4 = -4;
      }
      iVar12 = iVar7;
      if (iVar19 < 3) {
        iVar12 = iVar19;
      }
      if (iVar12 < -3) {
        iVar12 = -4;
      }
      if (iVar17 < 3) {
        iVar7 = iVar17;
      }
      if (iVar7 < -3) {
        iVar7 = -4;
      }
      bVar3 = block_colors[0].field_0.field_0.r << 3 | (char)iVar4 + (char)(iVar16 >> 0x1f) * -8;
      bVar6 = block_colors[0].field_0.field_0.g << 3 | (char)iVar12 + (char)(iVar19 >> 0x1f) * -8;
      bVar10 = block_colors[0].field_0.field_0.b << 3 | (char)iVar7 + (char)(iVar17 >> 0x1f) * -8;
    }
    *(byte *)pDst = bVar3;
    *(byte *)((long)pDst + 1) = bVar6;
    *(byte *)((long)pDst + 2) = bVar10;
    puVar22 = &(*block_pixels)[0].field_0.field_0.b;
    uVar14 = 0;
    uVar15 = 0;
    local_60 = puVar22;
    for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
      decoder_etc_block::get_block_colors((decoder_etc_block *)pDst,block_colors_1,(uint32_t)lVar13)
      ;
      for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
        local_58[lVar21] =
             (uint)block_colors_1[lVar21].field_0.field_0.b * 0x13 +
             (uint)block_colors_1[lVar21].field_0.field_0.g * 0xb7 +
             (uint)block_colors_1[lVar21].field_0.field_0.r * 0x36;
      }
      if ((*(byte *)((long)pDst + 3) & 1) == 0) {
        uVar8 = (uint32_t)lVar13 * 8;
        puVar18 = puVar22;
        for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
          for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
            if (0xf < uVar8) {
              __assert_fail("ofs < 16",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x34d8,
                            "void basist::etc1_determine_selectors(decoder_etc_block &, const color32 *, uint32_t, uint32_t)"
                           );
            }
            uVar20 = (uint)puVar18[lVar11] * 0x26 + (uint)puVar18[lVar11 + -1] * 0x16e +
                     (uint)puVar18[lVar11 + -2] * 0x6c;
            uVar15 = uVar15 | ("\x01"[(ulong)(uVar20 < (uint)(local_58[1] + local_58[2])) +
                                      (ulong)(uVar20 < (uint)(local_58[0] + local_58[1])) +
                                      (ulong)(uVar20 < (uint)(local_58[2] + local_58[3]))] & 1) <<
                              ((byte)uVar8 & 0x1f);
            uVar14 = uVar14 | (uint)("\x01"[(ulong)(uVar20 < (uint)(local_58[1] + local_58[2])) +
                                            (ulong)(uVar20 < (uint)(local_58[0] + local_58[1])) +
                                            (ulong)(uVar20 < (uint)(local_58[2] + local_58[3]))] >>
                                    1) << ((byte)uVar8 & 0x1f);
            uVar8 = uVar8 + 1;
          }
          puVar18 = puVar18 + 4;
        }
      }
      else {
        uVar9 = lVar13 * 2;
        puVar18 = local_60;
        for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
          for (lVar11 = 0; uVar8 = (uint)uVar9, lVar11 != 4; lVar11 = lVar11 + 1) {
            if (0xf < uVar8) {
              __assert_fail("ofs < 16",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x34c3,
                            "void basist::etc1_determine_selectors(decoder_etc_block &, const color32 *, uint32_t, uint32_t)"
                           );
            }
            uVar20 = (uint)puVar18[lVar11 * 4] * 0x26 + (uint)puVar18[lVar11 * 4 + -1] * 0x16e +
                     (uint)puVar18[lVar11 * 4 + -2] * 0x6c;
            uVar15 = uVar15 | ("\x01"[(ulong)(uVar20 < (uint)(local_58[1] + local_58[2])) +
                                      (ulong)(uVar20 < (uint)(local_58[0] + local_58[1])) +
                                      (ulong)(uVar20 < (uint)(local_58[2] + local_58[3]))] & 1) <<
                              ((byte)uVar9 & 0x1f);
            uVar14 = uVar14 | (uint)("\x01"[(ulong)(uVar20 < (uint)(local_58[1] + local_58[2])) +
                                            (ulong)(uVar20 < (uint)(local_58[0] + local_58[1])) +
                                            (ulong)(uVar20 < (uint)(local_58[2] + local_58[3]))] >>
                                    1) << ((byte)uVar9 & 0x1f);
            uVar9 = (ulong)(uVar8 + 4);
          }
          uVar9 = (ulong)(uVar8 - 0xf);
          puVar18 = puVar18 + 0x10;
        }
      }
      local_60 = local_60 + 0x20;
      puVar22 = puVar22 + 8;
    }
    *(ushort *)((long)pDst + 6) = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
    *(char *)((long)pDst + 5) = (char)uVar14;
    *(char *)((long)pDst + 4) = (char)(uVar14 >> 8);
  }
  return;
}

Assistant:

void transcode_uastc_to_etc1(unpacked_uastc_block& unpacked_src_blk, color32 block_pixels[4][4], void* pDst)
	{
		decoder_etc_block& dst_blk = *static_cast<decoder_etc_block*>(pDst);

		if (unpacked_src_blk.m_mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			dst_blk.m_bytes[3] = (uint8_t)((unpacked_src_blk.m_etc1_diff << 1) | (unpacked_src_blk.m_etc1_inten0 << 5) | (unpacked_src_blk.m_etc1_inten0 << 2));

			if (unpacked_src_blk.m_etc1_diff)
			{
				dst_blk.m_bytes[0] = (uint8_t)(unpacked_src_blk.m_etc1_r << 3);
				dst_blk.m_bytes[1] = (uint8_t)(unpacked_src_blk.m_etc1_g << 3);
				dst_blk.m_bytes[2] = (uint8_t)(unpacked_src_blk.m_etc1_b << 3);
			}
			else
			{
				dst_blk.m_bytes[0] = (uint8_t)(unpacked_src_blk.m_etc1_r | (unpacked_src_blk.m_etc1_r << 4));
				dst_blk.m_bytes[1] = (uint8_t)(unpacked_src_blk.m_etc1_g | (unpacked_src_blk.m_etc1_g << 4));
				dst_blk.m_bytes[2] = (uint8_t)(unpacked_src_blk.m_etc1_b | (unpacked_src_blk.m_etc1_b << 4));
			}

			memcpy(dst_blk.m_bytes + 4, &s_etc1_solid_selectors[unpacked_src_blk.m_etc1_selector][0], 4);

			return;
		}

		const bool flip = unpacked_src_blk.m_etc1_flip != 0;
		const bool diff = unpacked_src_blk.m_etc1_diff != 0;

		dst_blk.m_bytes[3] = (uint8_t)((int)flip | (diff << 1) | (unpacked_src_blk.m_etc1_inten0 << 5) | (unpacked_src_blk.m_etc1_inten1 << 2));

		const uint32_t limit = diff ? 31 : 15;

		color32 block_colors[2];

		for (uint32_t subset = 0; subset < 2; subset++)
		{
			uint32_t avg_color[3];
			memset(avg_color, 0, sizeof(avg_color));

			for (uint32_t j = 0; j < 8; j++)
			{
				const etc_coord2& c = g_etc1_pixel_coords[flip][subset][j];

				avg_color[0] += block_pixels[c.m_y][c.m_x].r;
				avg_color[1] += block_pixels[c.m_y][c.m_x].g;
				avg_color[2] += block_pixels[c.m_y][c.m_x].b;
			} // j

			block_colors[subset][0] = (uint8_t)((avg_color[0] * limit + 1020) / (8 * 255));
			block_colors[subset][1] = (uint8_t)((avg_color[1] * limit + 1020) / (8 * 255));
			block_colors[subset][2] = (uint8_t)((avg_color[2] * limit + 1020) / (8 * 255));
			block_colors[subset][3] = 0;

			if (g_uastc_mode_has_etc1_bias[unpacked_src_blk.m_mode])
			{
				block_colors[subset] = apply_etc1_bias(block_colors[subset], unpacked_src_blk.m_etc1_bias, limit, subset);
			}

		} // subset

		if (diff)
		{
			int dr = block_colors[1].r - block_colors[0].r;
			int dg = block_colors[1].g - block_colors[0].g;
			int db = block_colors[1].b - block_colors[0].b;

			dr = basisu::clamp<int>(dr, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			dg = basisu::clamp<int>(dg, cETC1ColorDeltaMin, cETC1ColorDeltaMax);
			db = basisu::clamp<int>(db, cETC1ColorDeltaMin, cETC1ColorDeltaMax);

			if (dr < 0) dr += 8;
			if (dg < 0) dg += 8;
			if (db < 0) db += 8;

			dst_blk.m_bytes[0] = (uint8_t)((block_colors[0].r << 3) | dr);
			dst_blk.m_bytes[1] = (uint8_t)((block_colors[0].g << 3) | dg);
			dst_blk.m_bytes[2] = (uint8_t)((block_colors[0].b << 3) | db);
		}
		else
		{
			dst_blk.m_bytes[0] = (uint8_t)(block_colors[1].r | (block_colors[0].r << 4));
			dst_blk.m_bytes[1] = (uint8_t)(block_colors[1].g | (block_colors[0].g << 4));
			dst_blk.m_bytes[2] = (uint8_t)(block_colors[1].b | (block_colors[0].b << 4));
		}

		etc1_determine_selectors(dst_blk, &block_pixels[0][0], 0, 2);
	}